

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RPLIDAR.h
# Opt level: O2

int SetMotorPWMRequestRPLIDAR(RPLIDAR *pRPLIDAR,int pwm)

{
  int iVar1;
  uchar reqbuf [6];
  
  reqbuf[5] = '\0';
  reqbuf[3] = (uchar)pwm;
  reqbuf[0] = 0xa5;
  reqbuf[1] = 0xf0;
  reqbuf[2] = '\x02';
  reqbuf[4] = (uchar)((uint)pwm >> 8);
  reqbuf[5] = ComputeChecksumRPLIDAR(reqbuf,6);
  iVar1 = WriteAllRS232Port(&pRPLIDAR->RS232Port,reqbuf,6);
  if (iVar1 == 0) {
    mSleep(500);
  }
  else {
    puts("Error writing data to a RPLIDAR. ");
  }
  return (uint)(iVar1 != 0);
}

Assistant:

inline int SetMotorPWMRequestRPLIDAR(RPLIDAR* pRPLIDAR, int pwm)
{
#ifdef ENABLE_RPLIDAR_SDK_SUPPORT
#ifdef FORCE_RPLIDAR_SDK_V1
	if (IS_FAIL(pRPLIDAR->drv->setMotorPWM((_u16)pwm)))
	{
		printf("A RPLIDAR is not responding correctly : setMotorPWM() failed. \n");
		return EXIT_FAILURE;
	}
#else
	if (SL_IS_FAIL(pRPLIDAR->drv->setMotorSpeed((sl_u16)pwm)))
	{
		printf("A RPLIDAR is not responding correctly : setMotorSpeed() failed. \n");
		return EXIT_FAILURE;
	}
#endif // FORCE_RPLIDAR_SDK_V1
#else
	unsigned char reqbuf[] = {START_FLAG1_RPLIDAR,SET_MOTOR_PWM_REQUEST_RPLIDAR,0x02,0,0,0};

	reqbuf[3] = (unsigned char)pwm;
	reqbuf[4] = (unsigned char)(pwm>>8);
	reqbuf[5] = ComputeChecksumRPLIDAR(reqbuf, sizeof(reqbuf));

	// Send request.
	if (WriteAllRS232Port(&pRPLIDAR->RS232Port, reqbuf, sizeof(reqbuf)) != EXIT_SUCCESS)
	{
		printf("Error writing data to a RPLIDAR. \n");
		return EXIT_FAILURE;
	}

	mSleep(500);
#endif // ENABLE_RPLIDAR_SDK_SUPPORT

	return EXIT_SUCCESS;
}